

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::OutputLinkLibraries
          (cmLocalGenerator *this,cmComputeLinkInformation *pcli,
          cmLinkLineComputer *linkLineComputer,string *linkLibraries,string *frameworkPath,
          string *linkPath)

{
  cmMakefile *pcVar1;
  string *libPathFlag;
  string *libPathTerminator;
  char *pcVar2;
  string *psVar3;
  string standardLibsVar;
  string stdLibString;
  string fwSearchFlagVar;
  string fwSearchFlag;
  string linkLanguage;
  string sStack_108;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [16];
  string *local_c8;
  string *local_c0;
  string *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50 [32];
  
  local_c8 = linkLibraries;
  local_c0 = linkPath;
  local_b8 = frameworkPath;
  std::__cxx11::string::string(local_50,(string *)&pcli->LinkLanguage);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_108,"CMAKE_LIBRARY_PATH_FLAG",(allocator<char> *)&local_e8);
  libPathFlag = cmMakefile::GetRequiredDefinition(pcVar1,&sStack_108);
  std::__cxx11::string::~string((string *)&sStack_108);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_108,"CMAKE_LIBRARY_PATH_TERMINATOR",(allocator<char> *)&local_e8);
  libPathTerminator = cmMakefile::GetSafeDefinition(pcVar1,&sStack_108);
  std::__cxx11::string::~string((string *)&sStack_108);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_108,"CMAKE_",(allocator<char> *)&local_e8);
  std::__cxx11::string::string((string *)&local_e8,(string *)&pcli->LinkLanguage);
  std::__cxx11::string::append((string *)&sStack_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::append((char *)&sStack_108);
  local_e8 = local_d8;
  local_e0 = 0;
  local_d8[0] = 0;
  pcVar2 = cmMakefile::GetDefinition(this->Makefile,&sStack_108);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::assign((char *)&local_e8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_",(allocator<char> *)&local_70);
  std::__cxx11::string::append((string *)&local_90);
  std::__cxx11::string::append((char *)&local_90);
  psVar3 = cmMakefile::GetSafeDefinition(this->Makefile,&local_90);
  std::__cxx11::string::string((string *)&local_70,(string *)psVar3);
  cmLinkLineComputer::ComputeFrameworkPath(&local_b0,linkLineComputer,pcli,&local_70);
  std::__cxx11::string::operator=((string *)local_b8,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  cmLinkLineComputer::ComputeLinkPath(&local_b0,linkLineComputer,pcli,libPathFlag,libPathTerminator)
  ;
  std::__cxx11::string::operator=((string *)local_c0,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  (*linkLineComputer->_vptr_cmLinkLineComputer[3])(&local_b0,linkLineComputer,pcli,&local_e8);
  std::__cxx11::string::operator=((string *)local_c8,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&sStack_108);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void cmLocalGenerator::OutputLinkLibraries(
  cmComputeLinkInformation* pcli, cmLinkLineComputer* linkLineComputer,
  std::string& linkLibraries, std::string& frameworkPath,
  std::string& linkPath)
{
  cmComputeLinkInformation& cli = *pcli;

  std::string linkLanguage = cli.GetLinkLanguage();

  const std::string& libPathFlag =
    this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_FLAG");
  const std::string& libPathTerminator =
    this->Makefile->GetSafeDefinition("CMAKE_LIBRARY_PATH_TERMINATOR");

  // Add standard libraries for this language.
  std::string standardLibsVar = "CMAKE_";
  standardLibsVar += cli.GetLinkLanguage();
  standardLibsVar += "_STANDARD_LIBRARIES";
  std::string stdLibString;
  if (const char* stdLibs = this->Makefile->GetDefinition(standardLibsVar)) {
    stdLibString = stdLibs;
  }

  // Append the framework search path flags.
  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += linkLanguage;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  std::string fwSearchFlag =
    this->Makefile->GetSafeDefinition(fwSearchFlagVar);

  frameworkPath = linkLineComputer->ComputeFrameworkPath(cli, fwSearchFlag);
  linkPath =
    linkLineComputer->ComputeLinkPath(cli, libPathFlag, libPathTerminator);

  linkLibraries = linkLineComputer->ComputeLinkLibraries(cli, stdLibString);
}